

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnicode.c
# Opt level: O0

JL_STATUS JlUnicodeCharFromUtf8
                    (char *Utf8String,size_t Utf8StringLength,uint32_t *pUnicodeValue,
                    size_t *pNumBytesUsed)

{
  bool bVar1;
  uint local_40;
  uint local_3c;
  uint32_t i;
  uint32_t unicode;
  JL_STATUS jlStatus;
  uint8_t topBits;
  size_t numBytesNeeded;
  size_t *pNumBytesUsed_local;
  uint32_t *pUnicodeValue_local;
  size_t Utf8StringLength_local;
  char *Utf8String_local;
  
  unicode._3_1_ = 0;
  if (((int)*Utf8String & 0xf8U) == 0xf0) {
    _jlStatus = 4;
    unicode._3_1_ = *Utf8String & 7;
    i = 0;
  }
  else if (((int)*Utf8String & 0xf0U) == 0xe0) {
    _jlStatus = 3;
    unicode._3_1_ = *Utf8String & 0xf;
    i = 0;
  }
  else if (((int)*Utf8String & 0xe0U) == 0xc0) {
    _jlStatus = 2;
    unicode._3_1_ = *Utf8String & 0x1f;
    i = 0;
  }
  else {
    bVar1 = ((int)*Utf8String & 0x80U) != 0;
    if (bVar1) {
      i = 0xfffffff9;
    }
    else {
      unicode._3_1_ = *Utf8String & 0x7f;
      i = 0;
    }
    _jlStatus = (ulong)!bVar1;
  }
  if (i == 0) {
    if (Utf8StringLength < _jlStatus) {
      i = 0xfffffff9;
    }
    else {
      local_3c = (uint)unicode._3_1_;
      for (local_40 = 1; local_40 < _jlStatus; local_40 = local_40 + 1) {
        if (((int)Utf8String[local_40] & 0xc0U) != 0x80) {
          i = 0xfffffff9;
          break;
        }
        local_3c = (int)Utf8String[local_40] & 0x3fU | local_3c << 6;
      }
      if (i == 0) {
        if ((local_3c < 0x110000) && ((local_3c < 0xd800 || (0xdfff < local_3c)))) {
          *pUnicodeValue = local_3c;
          *pNumBytesUsed = _jlStatus;
        }
        else {
          i = 0xfffffff9;
        }
      }
    }
  }
  return i;
}

Assistant:

JL_STATUS
    JlUnicodeCharFromUtf8
    (
        char const*     Utf8String,
        size_t          Utf8StringLength,
        uint32_t*       pUnicodeValue,
        size_t*         pNumBytesUsed
    )
{
    // Determine number of bytes needed.
    // We assume Utf8StringLength is at least 1 byte long.
    size_t numBytesNeeded = 0;
    uint8_t topBits = 0;
    JL_STATUS jlStatus;

    if( 0xf0 == (Utf8String[0] & 0xf8) )
    {
        numBytesNeeded = 4;
        topBits = Utf8String[0] & 0x07;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xe0 == (Utf8String[0] & 0xf0) )
    {
        numBytesNeeded = 3;
        topBits = Utf8String[0] & 0x0f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xc0 == (Utf8String[0] & 0xe0) )
    {
        numBytesNeeded = 2;
        topBits = Utf8String[0] & 0x1f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0x00 == (Utf8String[0] & 0x80) )
    {
        numBytesNeeded = 1;
        topBits = Utf8String[0] & 0x7f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Is either a continuation character without a start, or an invalid start such as
        // a 5 or 6 byte character which is not valid in UTF8
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( numBytesNeeded <= Utf8StringLength )
        {
            // Start with the top bits
            uint32_t unicode = topBits;

            /// Now slide in the next bits in sets of 6 for each continuation character
            for( uint32_t i=1; i<numBytesNeeded; i++ )
            {
                // Verify that this is a continuation utf8 char
                if( 0x80 == (Utf8String[i] & 0xc0) )
                {
                    unicode <<= 6;
                    unicode |= (Utf8String[i] & 0x3f );
                }
                else
                {
                    // Not a continuation character. This is invalid UTF8
                    jlStatus = JL_STATUS_INVALID_DATA;
                    break;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if(     unicode <= 0x10ffff
                    &&  (unicode < 0xd800 || unicode > 0xdfff) )
                {
                    // Valid unicode range (We don't allow UTF16 surrogate pairs to appear in the utf8)
                    *pUnicodeValue = unicode;
                    *pNumBytesUsed = numBytesNeeded;
                }
                else
                {
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
            }
        }
        else
        {
            // Not enough bytes to complete utf8 character
            jlStatus = JL_STATUS_INVALID_DATA;
        }
    }

    return jlStatus;
}